

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O2

bool CSOAA::ec_is_label_definition(example *ec)

{
  uchar *puVar1;
  wclass *pwVar2;
  uint32_t *puVar3;
  long lVar4;
  bool bVar5;
  
  puVar1 = (ec->super_example_predict).indices._begin;
  if (((ec->super_example_predict).indices._end != puVar1) && (*puVar1 == 'l')) {
    pwVar2 = (ec->l).cs.costs._begin;
    lVar4 = ((long)(ec->l).cs.costs._end - (long)pwVar2 >> 4) + 1;
    puVar3 = &pwVar2->class_index;
    while( true ) {
      lVar4 = lVar4 + -1;
      bVar5 = lVar4 == 0;
      if (bVar5) {
        return bVar5;
      }
      if (*puVar3 != 0) break;
      pwVar2 = (wclass *)(puVar3 + -1);
      puVar3 = puVar3 + 4;
      if (pwVar2->x <= 0.0) {
        return bVar5;
      }
    }
    return bVar5;
  }
  return false;
}

Assistant:

inline size_t size() const { return _end - _begin; }